

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDrawTests.cpp
# Opt level: O1

void deqp::gles3::Functional::anon_unknown_0::genBasicSpec(DrawTestSpec *spec,DrawMethod method)

{
  pointer pAVar1;
  
  spec->apiType = 3;
  spec->primitive = PRIMITIVE_TRIANGLES;
  spec->primitiveCount = 5;
  spec->drawMethod = method;
  spec->indexType = INDEXTYPE_LAST;
  spec->indexPointerOffset = 0;
  spec->indexStorage = STORAGE_LAST;
  spec->first = 0;
  spec->indexMin = 0;
  spec->indexMax = 0;
  spec->instanceCount = 1;
  std::
  vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ::resize(&spec->attribs,2);
  pAVar1 = (spec->attribs).
           super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pAVar1->inputType = INPUTTYPE_FLOAT;
  pAVar1->outputType = OUTPUTTYPE_VEC2;
  pAVar1->storage = STORAGE_BUFFER;
  pAVar1->usage = USAGE_STATIC_DRAW;
  pAVar1->componentCount = 4;
  pAVar1->instanceDivisor = 0;
  pAVar1->useDefaultAttribute = false;
  pAVar1[1].inputType = INPUTTYPE_FLOAT;
  pAVar1->offset = 0;
  pAVar1->stride = 0;
  pAVar1->normalize = false;
  pAVar1[1].outputType = OUTPUTTYPE_VEC2;
  pAVar1[1].storage = STORAGE_BUFFER;
  pAVar1[1].usage = USAGE_STATIC_DRAW;
  pAVar1[1].componentCount = 2;
  pAVar1[1].instanceDivisor = 0;
  pAVar1[1].useDefaultAttribute = false;
  pAVar1[1].offset = 0;
  pAVar1[1].stride = 0;
  pAVar1[1].normalize = false;
  return;
}

Assistant:

static void genBasicSpec (gls::DrawTestSpec& spec, gls::DrawTestSpec::DrawMethod method)
{
	spec.apiType				= glu::ApiType::es(3,0);
	spec.primitive				= gls::DrawTestSpec::PRIMITIVE_TRIANGLES;
	spec.primitiveCount			= 5;
	spec.drawMethod				= method;
	spec.indexType				= gls::DrawTestSpec::INDEXTYPE_LAST;
	spec.indexPointerOffset		= 0;
	spec.indexStorage			= gls::DrawTestSpec::STORAGE_LAST;
	spec.first					= 0;
	spec.indexMin				= 0;
	spec.indexMax				= 0;
	spec.instanceCount			= 1;

	spec.attribs.resize(2);

	spec.attribs[0].inputType				= gls::DrawTestSpec::INPUTTYPE_FLOAT;
	spec.attribs[0].outputType				= gls::DrawTestSpec::OUTPUTTYPE_VEC2;
	spec.attribs[0].storage					= gls::DrawTestSpec::STORAGE_BUFFER;
	spec.attribs[0].usage					= gls::DrawTestSpec::USAGE_STATIC_DRAW;
	spec.attribs[0].componentCount			= 4;
	spec.attribs[0].offset					= 0;
	spec.attribs[0].stride					= 0;
	spec.attribs[0].normalize				= false;
	spec.attribs[0].instanceDivisor			= 0;
	spec.attribs[0].useDefaultAttribute		= false;

	spec.attribs[1].inputType				= gls::DrawTestSpec::INPUTTYPE_FLOAT;
	spec.attribs[1].outputType				= gls::DrawTestSpec::OUTPUTTYPE_VEC2;
	spec.attribs[1].storage					= gls::DrawTestSpec::STORAGE_BUFFER;
	spec.attribs[1].usage					= gls::DrawTestSpec::USAGE_STATIC_DRAW;
	spec.attribs[1].componentCount			= 2;
	spec.attribs[1].offset					= 0;
	spec.attribs[1].stride					= 0;
	spec.attribs[1].normalize				= false;
	spec.attribs[1].instanceDivisor			= 0;
	spec.attribs[1].useDefaultAttribute		= false;
}